

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug * __thiscall QDebug::operator<<(QDebug *this,QString *t)

{
  QDebug *pQVar1;
  char16_t *pcVar2;
  
  pcVar2 = (t->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)this,(ulong)pcVar2);
  pQVar1 = maybeSpace(this);
  return pQVar1;
}

Assistant:

inline QDebug &operator<<(const QString & t) { putString(t.constData(), size_t(t.size())); return maybeSpace(); }